

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDtdPtr xmlSAXParseDTD(xmlSAXHandlerPtr sax,xmlChar *ExternalID,xmlChar *SystemID)

{
  resolveEntitySAXFunc p_Var1;
  uchar *in;
  _xmlNode *p_Var2;
  int iVar3;
  xmlCharEncoding enc;
  xmlParserCtxtPtr ctxt;
  xmlChar *pxVar4;
  xmlParserInputPtr input;
  xmlDocPtr pxVar5;
  xmlDtdPtr pxVar6;
  _xmlNode **pp_Var7;
  _xmlDtd *p_Var8;
  
  if (ExternalID == (xmlChar *)0x0 && SystemID == (xmlChar *)0x0) {
    return (xmlDtdPtr)0x0;
  }
  ctxt = xmlNewSAXParserCtxt(sax,(void *)0x0);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return (xmlDtdPtr)0x0;
  }
  *(byte *)&ctxt->options = (byte)ctxt->options | 4;
  pxVar4 = xmlCanonicPath(SystemID);
  if (pxVar4 == (xmlChar *)0x0 && SystemID != (xmlChar *)0x0) {
LAB_0016277f:
    xmlFreeParserCtxt(ctxt);
    return (xmlDtdPtr)0x0;
  }
  if ((((ctxt->sax == (_xmlSAXHandler *)0x0) ||
       (p_Var1 = ctxt->sax->resolveEntity, p_Var1 == (resolveEntitySAXFunc)0x0)) ||
      (input = (*p_Var1)(ctxt->userData,ExternalID,pxVar4), input == (xmlParserInputPtr)0x0)) ||
     (iVar3 = xmlPushInput(ctxt,input), iVar3 < 0)) {
    xmlFreeParserCtxt(ctxt);
    if (pxVar4 == (xmlChar *)0x0) {
      return (xmlDtdPtr)0x0;
    }
    (*xmlFree)(pxVar4);
    return (xmlDtdPtr)0x0;
  }
  in = ctxt->input->cur;
  if (3 < (long)ctxt->input->end - (long)in) {
    enc = xmlDetectCharEncoding(in,4);
    xmlSwitchEncoding(ctxt,enc);
  }
  if (input->filename == (char *)0x0) {
    input->filename = (char *)pxVar4;
  }
  else {
    (*xmlFree)(pxVar4);
  }
  input->line = 1;
  input->col = 1;
  pxVar4 = ctxt->input->cur;
  input->base = pxVar4;
  input->cur = pxVar4;
  input->free = (xmlParserInputDeallocate)0x0;
  ctxt->inSubset = 2;
  pxVar5 = xmlNewDoc("1.0");
  ctxt->myDoc = pxVar5;
  if (pxVar5 == (xmlDocPtr)0x0) {
    xmlErrMemory(ctxt,"New Doc failed");
    goto LAB_0016277f;
  }
  pxVar5->properties = 0x40;
  pxVar6 = xmlNewDtd(pxVar5,(xmlChar *)"none",ExternalID,SystemID);
  ctxt->myDoc->extSubset = pxVar6;
  xmlParseExternalSubset(ctxt,ExternalID,SystemID);
  pxVar5 = ctxt->myDoc;
  if (pxVar5 == (xmlDocPtr)0x0) {
    p_Var8 = (_xmlDtd *)0x0;
    goto LAB_00162901;
  }
  if (ctxt->wellFormed == 0) {
LAB_001628ef:
    p_Var8 = (_xmlDtd *)0x0;
  }
  else {
    p_Var8 = pxVar5->extSubset;
    pxVar5->extSubset = (_xmlDtd *)0x0;
    if (p_Var8 == (_xmlDtd *)0x0) goto LAB_001628ef;
    p_Var8->doc = (_xmlDoc *)0x0;
    pp_Var7 = &p_Var8->children;
    while (p_Var2 = *pp_Var7, p_Var2 != (_xmlNode *)0x0) {
      p_Var2->doc = (_xmlDoc *)0x0;
      pp_Var7 = &p_Var2->next;
    }
  }
  xmlFreeDoc(pxVar5);
  ctxt->myDoc = (xmlDocPtr)0x0;
LAB_00162901:
  xmlFreeParserCtxt(ctxt);
  return p_Var8;
}

Assistant:

xmlDtdPtr
xmlSAXParseDTD(xmlSAXHandlerPtr sax, const xmlChar *ExternalID,
                          const xmlChar *SystemID) {
    xmlDtdPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input = NULL;
    xmlCharEncoding enc;
    xmlChar* systemIdCanonic;

    if ((ExternalID == NULL) && (SystemID == NULL)) return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL) {
	return(NULL);
    }

    /* We are loading a DTD */
    ctxt->options |= XML_PARSE_DTDLOAD;

    /*
     * Canonicalise the system ID
     */
    systemIdCanonic = xmlCanonicPath(SystemID);
    if ((SystemID != NULL) && (systemIdCanonic == NULL)) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    /*
     * Ask the Entity resolver to load the damn thing
     */

    if ((ctxt->sax != NULL) && (ctxt->sax->resolveEntity != NULL))
	input = ctxt->sax->resolveEntity(ctxt->userData, ExternalID,
	                                 systemIdCanonic);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	if (systemIdCanonic != NULL)
	    xmlFree(systemIdCanonic);
	return(NULL);
    }

    /*
     * plug some encoding conversion routines here.
     */
    if (xmlPushInput(ctxt, input) < 0) {
	xmlFreeParserCtxt(ctxt);
	if (systemIdCanonic != NULL)
	    xmlFree(systemIdCanonic);
	return(NULL);
    }
    if ((ctxt->input->end - ctxt->input->cur) >= 4) {
	enc = xmlDetectCharEncoding(ctxt->input->cur, 4);
	xmlSwitchEncoding(ctxt, enc);
    }

    if (input->filename == NULL)
	input->filename = (char *) systemIdCanonic;
    else
	xmlFree(systemIdCanonic);
    input->line = 1;
    input->col = 1;
    input->base = ctxt->input->cur;
    input->cur = ctxt->input->cur;
    input->free = NULL;

    /*
     * let's parse that entity knowing it's an external subset.
     */
    ctxt->inSubset = 2;
    ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
    if (ctxt->myDoc == NULL) {
	xmlErrMemory(ctxt, "New Doc failed");
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    ctxt->myDoc->properties = XML_DOC_INTERNAL;
    ctxt->myDoc->extSubset = xmlNewDtd(ctxt->myDoc, BAD_CAST "none",
	                               ExternalID, SystemID);
    xmlParseExternalSubset(ctxt, ExternalID, SystemID);

    if (ctxt->myDoc != NULL) {
	if (ctxt->wellFormed) {
	    ret = ctxt->myDoc->extSubset;
	    ctxt->myDoc->extSubset = NULL;
	    if (ret != NULL) {
		xmlNodePtr tmp;

		ret->doc = NULL;
		tmp = ret->children;
		while (tmp != NULL) {
		    tmp->doc = NULL;
		    tmp = tmp->next;
		}
	    }
	} else {
	    ret = NULL;
	}
        xmlFreeDoc(ctxt->myDoc);
        ctxt->myDoc = NULL;
    }
    xmlFreeParserCtxt(ctxt);

    return(ret);
}